

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O1

type dukglue::detail::FuncInfoHolder<Shape*,std::__cxx11::string_const&>::FuncRuntime::
     actually_call<Shape*,std::__cxx11::string>
               (duk_context *ctx,
               _func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *funcToCall,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *args)

{
  Shape *value;
  
  value = apply_fp<Shape*,std::__cxx11::string_const&,std::__cxx11::string>(funcToCall,args);
  if (value != (Shape *)0x0) {
    types::DukType<Shape>::push<Shape&,void>(ctx,value);
    return;
  }
  duk_push_null(ctx);
  return;
}

Assistant:

static typename std::enable_if<!std::is_void<Dummy>::value>::type actually_call(duk_context* ctx, RetType(*funcToCall)(Ts...), const std::tuple<BakedTs...>& args)
				{
					// ArgStorage has some static_asserts in it that validate value types,
					// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
					typedef typename dukglue::types::ArgStorage<RetType>::type ValidateReturnType;

					RetType return_val = dukglue::detail::apply_fp(funcToCall, args);

					using namespace dukglue::types;
					DukType<typename Bare<RetType>::type>::template push<RetType>(ctx, std::move(return_val));
				}